

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr_ops.cc
# Opt level: O1

filemgr_ops * get_filemgr_ops(void)

{
  return &linux_ops;
}

Assistant:

struct filemgr_ops * get_filemgr_ops()
{
#if defined(WIN32) || defined(_WIN32)
    // windows
    return get_win_filemgr_ops();
#else
    // linux, mac os x
    return get_linux_filemgr_ops();
#endif
}